

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Heap::addIfHeapEntity
          (Heap *this,HeapEntity *v,
          vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          *vec)

{
  value_type *in_RDI;
  
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(vec,in_RDI);
  return;
}

Assistant:

void addIfHeapEntity(HeapEntity *v, std::vector<HeapEntity *> &vec)
    {
        vec.push_back(v);
    }